

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O3

Float<unsigned_short,_5,_10,_15,_3U>
tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_long,11,52,1023,3u>
          (Float<unsigned_long,_11,_52,_1023,_3U> *other)

{
  ulong uVar1;
  long lVar2;
  ushort uVar3;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  
  uVar1 = other->m_value;
  if ((uVar1 & 0x7fffffffffffffff) != 0x7ff0000000000000) {
    uVar6 = uVar1 & 0xfffffffffffff;
    if ((uVar1 & 0x7ff0000000000000) == 0x7ff0000000000000 && uVar6 != 0) {
      return (Float<unsigned_short,_5,_10,_15,_3U>)0x7fff;
    }
    uVar3 = (ushort)(uVar1 >> 0x30);
    if ((uVar1 & 0x7fffffffffffffff) == 0) {
      return (Float<unsigned_short,_5,_10,_15,_3U>)uVar3;
    }
    uVar3 = uVar3 & 0x8000;
    if ((uVar1 & 0x7ff0000000000000) == 0 && uVar6 != 0) {
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar6 = uVar6 << (~(byte)lVar2 + 0x35 & 0x3f);
      uVar7 = ((uint)lVar2 ^ 0xffffffc0) - 0x3f2;
    }
    else {
      uVar7 = ((uint)(uVar1 >> 0x34) & 0x7ff) - 0x3ff;
      uVar6 = uVar6 | 0x10000000000000;
    }
    if ((int)uVar7 < -0xe) {
      if (uVar7 < 0xffffffe7) {
        return (Float<unsigned_short,_5,_10,_15,_3U>)uVar3;
      }
      return (Float<unsigned_short,_5,_10,_15,_3U>)
             (uVar3 | (ushort)(~(-1L << (0x1bU - (char)uVar7 & 0x3f)) + uVar6 +
                               (ulong)((uVar6 >> ((ulong)(0x1c - uVar7) & 0x3f) & 1) != 0) >>
                              ((byte)(0x1c - uVar7) & 0x3f)));
    }
    uVar6 = (uVar6 & 0xffefffffffffffff) + 0x1ffffffffff + (ulong)((uVar6 >> 0x2a & 1) != 0);
    uVar5 = uVar6 & 0x10000000000000;
    iVar8 = uVar7 + (uint)(uVar5 >> 0x34);
    if (iVar8 < 0x10) {
      uVar4 = (ushort)(uint)(uVar6 >> 0x2a);
      if (uVar5 != 0) {
        uVar4 = 0;
      }
      return (Float<unsigned_short,_5,_10,_15,_3U>)(uVar4 | uVar3 | (short)iVar8 * 0x400 + 0x3c00U);
    }
  }
  return (Float<unsigned_short,_5,_10,_15,_3U>)((ushort)(-1 < (long)uVar1) * -0x8000 - 0x400);
}

Assistant:

Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>
Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>::convert
	(const Float<OtherStorageType, OtherExponentBits, OtherMantissaBits, OtherExponentBias, OtherFlags>& other)
{
	if (!(Flags & FLOAT_HAS_SIGN) && other.sign() < 0)
	{
		// Negative number, truncate to zero.
		return zero(+1);
	}
	else if (other.isInf())
	{
		return inf(other.sign());
	}
	else if (other.isNaN())
	{
		return nan();
	}
	else if (other.isZero())
	{
		return zero(other.sign());
	}
	else
	{
		const int			eMin	= 1 - ExponentBias;
		const int			eMax	= ((1<<ExponentBits)-2) - ExponentBias;

		const StorageType	s		= StorageType((StorageType(other.signBit())) << (StorageType(ExponentBits+MantissaBits))); // \note Not sign, but sign bit.
		int					e		= other.exponent();
		deUint64			m		= other.mantissa();

		// Normalize denormalized values prior to conversion.
		while (!(m & (1ull<<OtherMantissaBits)))
		{
			m <<= 1;
			e  -= 1;
		}

		if (e < eMin)
		{
			// Underflow.
			if ((Flags & FLOAT_SUPPORT_DENORM) && (eMin-e-1 <= MantissaBits))
			{
				// Shift and round (RTE).
				int			bitDiff	= (OtherMantissaBits-MantissaBits) + (eMin-e);
				deUint64	half	= (1ull << (bitDiff - 1)) - 1;
				deUint64	bias	= (m >> bitDiff) & 1;

				return Float(StorageType(s | (m + half + bias) >> bitDiff));
			}
			else
				return zero(other.sign());
		}
		else
		{
			// Remove leading 1.
			m = m & ~(1ull<<OtherMantissaBits);

			if (MantissaBits < OtherMantissaBits)
			{
				// Round mantissa (round to nearest even).
				int			bitDiff	= OtherMantissaBits-MantissaBits;
				deUint64	half	= (1ull << (bitDiff - 1)) - 1;
				deUint64	bias	= (m >> bitDiff) & 1;

				m = (m + half + bias) >> bitDiff;

				if (m & (1ull<<MantissaBits))
				{
					// Overflow in mantissa.
					m  = 0;
					e += 1;
				}
			}
			else
			{
				int bitDiff = MantissaBits-OtherMantissaBits;
				m = m << bitDiff;
			}

			if (e > eMax)
			{
				// Overflow.
				return inf(other.sign());
			}
			else
			{
				DE_ASSERT(de::inRange(e, eMin, eMax));
				DE_ASSERT(((e + ExponentBias) & ~((1ull<<ExponentBits)-1)) == 0);
				DE_ASSERT((m & ~((1ull<<MantissaBits)-1)) == 0);

				return Float(StorageType(s | (StorageType(e + ExponentBias) << MantissaBits) | m));
			}
		}
	}
}